

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O0

bool mahjong::is_waiting(hand_tiles_t *hand_tiles,useful_table_t *useful_table)

{
  bool bVar1;
  bool *pbVar2;
  bool *pbVar3;
  bool *pbVar4;
  bool *pbVar5;
  byte local_d9;
  bool local_b8 [8];
  useful_table_t table_basic;
  bool local_68 [8];
  useful_table_t table_special;
  bool basic_waiting;
  bool spcial_waiting;
  useful_table_t *useful_table_local;
  hand_tiles_t *hand_tiles_local;
  
  table_special[0x47] = false;
  table_special[0x46] = false;
  if (hand_tiles->tile_count == 0xd) {
    bVar1 = is_thirteen_orphans_wait(hand_tiles->standing_tiles,0xd,(useful_table_t *)local_68);
    if (bVar1) {
      table_special[0x47] = true;
    }
    else {
      bVar1 = is_honors_and_knitted_tiles_wait
                        (hand_tiles->standing_tiles,0xd,(useful_table_t *)local_68);
      if (bVar1) {
        table_special[0x47] = true;
      }
      else {
        bVar1 = is_seven_pairs_wait(hand_tiles->standing_tiles,0xd,(useful_table_t *)local_68);
        if (bVar1) {
          table_special[0x47] = true;
        }
        else {
          bVar1 = is_knitted_straight_wait
                            (hand_tiles->standing_tiles,0xd,(useful_table_t *)local_68);
          if (bVar1) {
            table_special[0x47] = true;
          }
        }
      }
    }
  }
  else if ((hand_tiles->tile_count == 10) &&
          (bVar1 = is_knitted_straight_wait
                             (hand_tiles->standing_tiles,10,(useful_table_t *)local_68), bVar1)) {
    table_special[0x47] = true;
  }
  bVar1 = is_basic_form_wait(hand_tiles->standing_tiles,hand_tiles->tile_count,
                             (useful_table_t *)local_b8);
  if (bVar1) {
    table_special[0x46] = true;
  }
  if (useful_table != (useful_table_t *)0x0) {
    if (((table_special[0x47] & 1U) == 0) || ((table_special[0x46] & 1U) == 0)) {
      if ((table_special[0x46] & 1U) == 0) {
        if ((table_special[0x47] & 1U) != 0) {
          memcpy(useful_table,local_68,0x48);
        }
      }
      else {
        memcpy(useful_table,local_b8,0x48);
      }
    }
    else {
      pbVar2 = std::begin<bool,72ul>((bool (*) [72])local_68);
      pbVar3 = std::end<bool,72ul>((bool (*) [72])local_68);
      pbVar4 = std::begin<bool,72ul>((bool (*) [72])local_b8);
      pbVar5 = std::begin<bool,72ul>(useful_table);
      std::
      transform<bool*,bool*,bool*,mahjong::is_waiting(mahjong::hand_tiles_t_const&,bool(*)[72])::__0>
                (pbVar2,pbVar3,pbVar4,pbVar5);
    }
  }
  local_d9 = 1;
  if ((table_special[0x47] & 1U) == 0) {
    local_d9 = table_special[0x46];
  }
  return (bool)(local_d9 & 1);
}

Assistant:

bool is_waiting(const hand_tiles_t &hand_tiles, useful_table_t *useful_table) {
    bool spcial_waiting = false, basic_waiting = false;
    useful_table_t table_special, table_basic;

    if (hand_tiles.tile_count == 13) {
        if (is_thirteen_orphans_wait(hand_tiles.standing_tiles, 13, &table_special)) {
            spcial_waiting = true;
        }
        else if (is_honors_and_knitted_tiles_wait(hand_tiles.standing_tiles, 13, &table_special)) {
            spcial_waiting = true;
        }
        else if (is_seven_pairs_wait(hand_tiles.standing_tiles, 13, &table_special)) {
            spcial_waiting = true;
        }
        else if (is_knitted_straight_wait(hand_tiles.standing_tiles, 13, &table_special)) {
            spcial_waiting = true;
        }
    }
    else if (hand_tiles.tile_count == 10) {
        if (is_knitted_straight_wait(hand_tiles.standing_tiles, 10, &table_special)) {
            spcial_waiting = true;
        }
    }

    if (is_basic_form_wait(hand_tiles.standing_tiles, hand_tiles.tile_count, &table_basic)) {
        basic_waiting = true;
    }

    if (useful_table != nullptr) {
        if (spcial_waiting && basic_waiting) {
            std::transform(std::begin(table_special), std::end(table_special), std::begin(table_basic), std::begin(*useful_table),
                [](bool a, bool b) { return a || b; });
        }
        else if (basic_waiting) {
            memcpy(*useful_table, table_basic, sizeof(table_basic));
        }
        else if (spcial_waiting) {
            memcpy(*useful_table, table_special, sizeof(table_special));
        }
    }

    return (spcial_waiting || basic_waiting);
}